

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O3

void bn_mul_recursive(unsigned_long *r,unsigned_long *a,unsigned_long *b,int n2,int dna,int dnb,
                     unsigned_long *t)

{
  unsigned_long *a_00;
  ulong *puVar1;
  unsigned_long uVar2;
  bool bVar3;
  bool bVar4;
  uint n2_00;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  unsigned_long *puVar9;
  int cl;
  unsigned_long *puVar10;
  unsigned_long *puVar11;
  int cl_00;
  int dl;
  
  uVar8 = (ulong)(uint)n2;
  if (n2 == 8 && (dnb == 0 && dna == 0)) {
    bn_mul_comba8(r,a,b);
    return;
  }
  if (n2 < 0x10) {
    bn_mul_normal(r,a,n2 + dna,b,dnb + n2);
    if (-1 < dnb + dna) {
      return;
    }
    memset(r + (dna + n2 * 2 + dnb),0,(ulong)(uint)-(dnb + dna) << 3);
    return;
  }
  n2_00 = n2 / 2;
  cl = n2_00 + dna;
  cl_00 = n2_00 + dnb;
  puVar9 = a + n2_00;
  dl = -dna;
  iVar5 = bn_cmp_part_words(a,puVar9,cl,dl);
  a_00 = b + n2_00;
  iVar6 = bn_cmp_part_words(a_00,b,cl_00,dnb);
  bVar3 = true;
  switch(iVar6 + iVar5 * 3) {
  case 2:
    bn_sub_part_words(t,a,puVar9,cl,dl);
    puVar10 = a_00;
    puVar11 = b;
    iVar5 = -dnb;
LAB_001140b1:
    bn_sub_part_words(t + n2_00,puVar11,puVar10,cl_00,iVar5);
    bVar4 = false;
    goto LAB_00114106;
  case 4:
    bn_sub_part_words(t,a,puVar9,cl,dl);
    puVar10 = b;
    puVar11 = a_00;
    iVar5 = dnb;
LAB_001140fb:
    bn_sub_part_words(t + n2_00,puVar11,puVar10,cl_00,iVar5);
    break;
  case -4:
    bn_sub_part_words(t,puVar9,a,cl,dna);
    iVar5 = -dnb;
    puVar10 = a_00;
    puVar11 = b;
    goto LAB_001140fb;
  case -3:
  case -1:
  case 0:
  case 1:
  case 3:
    bVar3 = false;
    break;
  case -2:
    bn_sub_part_words(t,puVar9,a,cl,dna);
    puVar10 = b;
    puVar11 = a_00;
    iVar5 = dnb;
    goto LAB_001140b1;
  }
  bVar4 = true;
LAB_00114106:
  if ((n2 & 0x7ffffffeU) == 8 && (dnb == 0 && dna == 0)) {
    puVar10 = t + uVar8;
    if (bVar3) {
      bn_mul_comba4(puVar10,t,t + n2_00);
    }
    else {
      puVar10[6] = 0;
      puVar10[7] = 0;
      puVar10[4] = 0;
      puVar10[5] = 0;
      puVar10[2] = 0;
      puVar10[3] = 0;
      *puVar10 = 0;
      puVar10[1] = 0;
    }
    bn_mul_comba4(r,a,b);
    bn_mul_comba4(r + uVar8,puVar9,a_00);
  }
  else if ((n2 & 0x7ffffffeU) == 0x10 && (dnb == 0 && dna == 0)) {
    puVar10 = t + uVar8;
    if (bVar3) {
      bn_mul_comba8(puVar10,t,t + n2_00);
    }
    else {
      puVar10[0xe] = 0;
      puVar10[0xf] = 0;
      puVar10[0xc] = 0;
      puVar10[0xd] = 0;
      puVar10[10] = 0;
      puVar10[0xb] = 0;
      puVar10[8] = 0;
      puVar10[9] = 0;
      puVar10[6] = 0;
      puVar10[7] = 0;
      puVar10[4] = 0;
      puVar10[5] = 0;
      puVar10[2] = 0;
      puVar10[3] = 0;
      *puVar10 = 0;
      puVar10[1] = 0;
    }
    bn_mul_comba8(r,a,b);
    bn_mul_comba8(r + uVar8,puVar9,a_00);
  }
  else {
    puVar10 = t + (uint)(n2 * 2);
    if (bVar3) {
      bn_mul_recursive(t + uVar8,t,t + n2_00,n2_00,0,0,puVar10);
    }
    else {
      memset(t + uVar8,0,uVar8 * 8);
    }
    bn_mul_recursive(r,a,b,n2_00,0,0,puVar10);
    bn_mul_recursive(r + uVar8,puVar9,a_00,n2_00,dna,dnb,puVar10);
  }
  uVar7 = bn_add_words(t,r,r + uVar8,n2);
  puVar1 = t + uVar8;
  if (bVar4) {
    uVar8 = bn_add_words(puVar1,puVar1,t,n2);
    iVar5 = (int)uVar8;
  }
  else {
    uVar8 = bn_sub_words(puVar1,t,puVar1,n2);
    iVar5 = -(int)uVar8;
  }
  uVar8 = bn_add_words(r + n2_00,r + n2_00,puVar1,n2);
  iVar5 = (int)uVar8 + iVar5 + (int)uVar7;
  if (iVar5 != 0) {
    puVar1 = r + (n2_00 + n2);
    uVar8 = *puVar1;
    *puVar1 = *puVar1 + (long)iVar5;
    if (CARRY8(uVar8,(long)iVar5)) {
      puVar9 = r + (ulong)(n2_00 + n2) + 1;
      do {
        *puVar9 = *puVar9 + 1;
        uVar2 = *puVar9;
        puVar9 = puVar9 + 1;
      } while (uVar2 == 0);
    }
  }
  return;
}

Assistant:

void bn_mul_recursive(BN_ULONG *r, BN_ULONG *a, BN_ULONG *b, int n2,
                      int dna, int dnb, BN_ULONG *t)
{
    int n = n2 / 2, c1, c2;
    int tna = n + dna, tnb = n + dnb;
    unsigned int neg, zero;
    BN_ULONG ln, lo, *p;

# ifdef BN_MUL_COMBA
#  if 0
    if (n2 == 4) {
        bn_mul_comba4(r, a, b);
        return;
    }
#  endif
    /*
     * Only call bn_mul_comba 8 if n2 == 8 and the two arrays are complete
     * [steve]
     */
    if (n2 == 8 && dna == 0 && dnb == 0) {
        bn_mul_comba8(r, a, b);
        return;
    }
# endif                         /* BN_MUL_COMBA */
    /* Else do normal multiply */
    if (n2 < BN_MUL_RECURSIVE_SIZE_NORMAL) {
        bn_mul_normal(r, a, n2 + dna, b, n2 + dnb);
        if ((dna + dnb) < 0)
            memset(&r[2 * n2 + dna + dnb], 0,
                   sizeof(BN_ULONG) * -(dna + dnb));
        return;
    }
    /* r=(a[0]-a[1])*(b[1]-b[0]) */
    c1 = bn_cmp_part_words(a, &(a[n]), tna, n - tna);
    c2 = bn_cmp_part_words(&(b[n]), b, tnb, tnb - n);
    zero = neg = 0;
    switch (c1 * 3 + c2) {
    case -4:
        bn_sub_part_words(t, &(a[n]), a, tna, tna - n); /* - */
        bn_sub_part_words(&(t[n]), b, &(b[n]), tnb, n - tnb); /* - */
        break;
    case -3:
        zero = 1;
        break;
    case -2:
        bn_sub_part_words(t, &(a[n]), a, tna, tna - n); /* - */
        bn_sub_part_words(&(t[n]), &(b[n]), b, tnb, tnb - n); /* + */
        neg = 1;
        break;
    case -1:
    case 0:
    case 1:
        zero = 1;
        break;
    case 2:
        bn_sub_part_words(t, a, &(a[n]), tna, n - tna); /* + */
        bn_sub_part_words(&(t[n]), b, &(b[n]), tnb, n - tnb); /* - */
        neg = 1;
        break;
    case 3:
        zero = 1;
        break;
    case 4:
        bn_sub_part_words(t, a, &(a[n]), tna, n - tna);
        bn_sub_part_words(&(t[n]), &(b[n]), b, tnb, tnb - n);
        break;
    }

# ifdef BN_MUL_COMBA
    if (n == 4 && dna == 0 && dnb == 0) { /* XXX: bn_mul_comba4 could take
                                           * extra args to do this well */
        if (!zero)
            bn_mul_comba4(&(t[n2]), t, &(t[n]));
        else
            memset(&t[n2], 0, sizeof(*t) * 8);

        bn_mul_comba4(r, a, b);
        bn_mul_comba4(&(r[n2]), &(a[n]), &(b[n]));
    } else if (n == 8 && dna == 0 && dnb == 0) { /* XXX: bn_mul_comba8 could
                                                  * take extra args to do
                                                  * this well */
        if (!zero)
            bn_mul_comba8(&(t[n2]), t, &(t[n]));
        else
            memset(&t[n2], 0, sizeof(*t) * 16);

        bn_mul_comba8(r, a, b);
        bn_mul_comba8(&(r[n2]), &(a[n]), &(b[n]));
    } else
# endif                         /* BN_MUL_COMBA */
    {
        p = &(t[n2 * 2]);
        if (!zero)
            bn_mul_recursive(&(t[n2]), t, &(t[n]), n, 0, 0, p);
        else
            memset(&t[n2], 0, sizeof(*t) * n2);
        bn_mul_recursive(r, a, b, n, 0, 0, p);
        bn_mul_recursive(&(r[n2]), &(a[n]), &(b[n]), n, dna, dnb, p);
    }

    /*-
     * t[32] holds (a[0]-a[1])*(b[1]-b[0]), c1 is the sign
     * r[10] holds (a[0]*b[0])
     * r[32] holds (b[1]*b[1])
     */

    c1 = (int)(bn_add_words(t, r, &(r[n2]), n2));

    if (neg) {                  /* if t[32] is negative */
        c1 -= (int)(bn_sub_words(&(t[n2]), t, &(t[n2]), n2));
    } else {
        /* Might have a carry */
        c1 += (int)(bn_add_words(&(t[n2]), &(t[n2]), t, n2));
    }

    /*-
     * t[32] holds (a[0]-a[1])*(b[1]-b[0])+(a[0]*b[0])+(a[1]*b[1])
     * r[10] holds (a[0]*b[0])
     * r[32] holds (b[1]*b[1])
     * c1 holds the carry bits
     */
    c1 += (int)(bn_add_words(&(r[n]), &(r[n]), &(t[n2]), n2));
    if (c1) {
        p = &(r[n + n2]);
        lo = *p;
        ln = (lo + c1) & BN_MASK2;
        *p = ln;

        /*
         * The overflow will stop before we over write words we should not
         * overwrite
         */
        if (ln < (BN_ULONG)c1) {
            do {
                p++;
                lo = *p;
                ln = (lo + 1) & BN_MASK2;
                *p = ln;
            } while (ln == 0);
        }
    }
}